

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_strip_components.c
# Opt level: O2

void test_strip_components(void)

{
  wchar_t wVar1;
  wchar_t wVar2;
  char *pcVar3;
  
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                     ,L'\x1e',"d0",L'ǭ');
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                  ,L'\x1f',"d0");
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                     ,L' ',"d1",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                     ,L'!',"d1/d2",L'ǭ');
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                     ,L'\"',"d1/d2/d3",L'ǭ');
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                      ,L'#',"d1/d2/f1",L'Ƥ',L'\xffffffff',"");
  assertion_make_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'$',"l1","d1/d2/f1");
  assertion_make_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'%',"d1/l2","d1/d2/f1");
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
               ,L'\'',"s1","d1/d2/f1");
    assertion_make_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
               ,L'(',"d1/s2","d2/f1");
  }
  assertion_chdir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                  ,L'*',"..");
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    wVar2 = systemf("%s -cf test.tar d0/l1 d0/d1",testprog);
    pcVar3 = "systemf(\"%s -cf test.tar d0/l1 d0/d1\", testprog)";
    wVar1 = L'4';
  }
  else {
    wVar2 = systemf("%s -cf test.tar d0/l1 d0/s1 d0/d1",testprog);
    pcVar3 = "systemf(\"%s -cf test.tar d0/l1 d0/s1 d0/d1\", testprog)";
    wVar1 = L'1';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                      ,wVar1,0,"0",(long)wVar2,pcVar3,(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                     ,L'6',"target",L'ǭ');
  wVar1 = systemf("%s -x -C target --strip-components 2 -f test.tar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                      ,L'8',0,"0",(long)wVar1,
                      "systemf(\"%s -x -C target --strip-components 2 \" \"-f test.tar\", testprog)"
                      ,(void *)0x0);
  failure("d0/ is too short and should not get restored");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L';',"target/d0");
  failure("d0/d1/ is too short and should not get restored");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'=',"target/d1");
  failure("d0/s1 is too short and should not get restored");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'?',"target/s1");
  failure("d0/d1/s2 is a symlink to something that won\'t be extracted");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'C',"target/s2");
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
               ,L'E',"target/s2","d2/f1");
  }
  failure("d0/d1/d2 should be extracted");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                   ,L'G',"target/d2",L'\xffffffff');
  failure("d0/l1 is too short and should not get restored");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'a',"target/l1");
  failure("d0/d1/l2 is a hardlink to file whose name was too short");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'c',"target/l2");
  failure("d0/d1/d2/f1 is a hardlink to file whose name was too short");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'e',"target/d2/f1");
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    wVar2 = systemf("%s --strip-components 2 -cf test2.tar d0/l1 d0/d1",testprog);
    pcVar3 = "systemf(\"%s --strip-components 2 -cf test2.tar \" \"d0/l1 d0/d1\", testprog)";
    wVar1 = L'o';
  }
  else {
    wVar2 = systemf("%s --strip-components 2 -cf test2.tar d0/l1 d0/s1 d0/d1",testprog);
    pcVar3 = "systemf(\"%s --strip-components 2 -cf test2.tar \" \"d0/l1 d0/s1 d0/d1\", testprog)";
    wVar1 = L'l';
  }
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                      ,wVar1,0,"0",(long)wVar2,pcVar3,(void *)0x0);
  assertion_make_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                     ,L'q',"target2",L'ǭ');
  wVar1 = systemf("%s -x -C target2 -f test2.tar",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                      ,L'r',0,"0",(long)wVar1,"systemf(\"%s -x -C target2 -f test2.tar\", testprog)"
                      ,(void *)0x0);
  failure("d0/ is too short and should not have been archived");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'u',"target2/d0");
  failure("d0/d1/ is too short and should not have been archived");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'w',"target2/d1");
  failure("d0/s1 is too short and should not get restored");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'y',"target/s1");
  wVar1 = canSymlink();
  if (wVar1 != L'\0') {
    failure("d0/d1/s2 is a symlink to something included in archive");
    assertion_is_symlink
              ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
               ,L'}',"target2/s2","d2/f1");
  }
  failure("d0/d1/d2 should be archived");
  assertion_is_dir("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
                   ,L'\x80',"target2/d2",L'\xffffffff');
  failure("d0/l1 is too short and should not have been archived");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'\x86',"target/l1");
  failure("d0/d1/l2 is a hardlink to file whose name was too short");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'\x88',"target/l2");
  failure("d0/d1/d2/f1 is a hardlink to file whose name was too short");
  assertion_file_not_exists
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/tar/test/test_strip_components.c"
             ,L'\x8a',"target/d2/f1");
  return;
}

Assistant:

DEFINE_TEST(test_strip_components)
{
	assertMakeDir("d0", 0755);
	assertChdir("d0");
	assertMakeDir("d1", 0755);
	assertMakeDir("d1/d2", 0755);
	assertMakeDir("d1/d2/d3", 0755);
	assertMakeFile("d1/d2/f1", 0644, "");
	assertMakeHardlink("l1", "d1/d2/f1");
	assertMakeHardlink("d1/l2", "d1/d2/f1");
	if (canSymlink()) {
		assertMakeSymlink("s1", "d1/d2/f1");
		assertMakeSymlink("d1/s2", "d2/f1");
	}
	assertChdir("..");

	/*
	 * Test 1: Strip components when extracting archives.
	 */
	if (canSymlink())
		assertEqualInt(0, systemf("%s -cf test.tar d0/l1 d0/s1 d0/d1",
		    testprog));
	else
		assertEqualInt(0, systemf("%s -cf test.tar d0/l1 d0/d1",
		    testprog));

	assertMakeDir("target", 0755);
	assertEqualInt(0, systemf("%s -x -C target --strip-components 2 "
	    "-f test.tar", testprog));

	failure("d0/ is too short and should not get restored");
	assertFileNotExists("target/d0");
	failure("d0/d1/ is too short and should not get restored");
	assertFileNotExists("target/d1");
	failure("d0/s1 is too short and should not get restored");
	assertFileNotExists("target/s1");
	failure("d0/d1/s2 is a symlink to something that won't be extracted");
	/* If platform supports symlinks, target/s2 is a broken symlink. */
	/* If platform does not support symlink, target/s2 doesn't exist. */
	assertFileNotExists("target/s2");
	if (canSymlink())
		assertIsSymlink("target/s2", "d2/f1");
	failure("d0/d1/d2 should be extracted");
	assertIsDir("target/d2", -1);

	/*
	 * Test 1b: Strip components extracting archives involving hardlinks.
	 *
	 * This next is a complicated case.  d0/l1, d0/d1/l2, and
	 * d0/d1/d2/f1 are all hardlinks to the same file; d0/l1 can't
	 * be extracted with --strip-components=2 and the other two
	 * can.  Remember that tar normally stores the first file with
	 * a body and the other as hardlink entries to the first
	 * appearance.  So the final result depends on the order in
	 * which these three names get archived.  If d0/l1 is first,
	 * none of the three can be restored.  If either of the longer
	 * names are first, then the two longer ones can both be
	 * restored.  Note that the "tar -cf" command above explicitly
	 * lists d0/l1 before d0/d1.
	 *
	 * It may be worth extending this test to exercise other
	 * archiving orders.
	 *
	 * Of course, this is all totally different for cpio and newc
	 * formats because the hardlink management is different.
	 * TODO: Rename this to test_strip_components_tar and create
	 * parallel tests for cpio and newc formats.
	 */
	failure("d0/l1 is too short and should not get restored");
	assertFileNotExists("target/l1");
	failure("d0/d1/l2 is a hardlink to file whose name was too short");
	assertFileNotExists("target/l2");
	failure("d0/d1/d2/f1 is a hardlink to file whose name was too short");
	assertFileNotExists("target/d2/f1");

	/*
	 * Test 2: Strip components when creating archives.
	 */
	if (canSymlink())
		assertEqualInt(0, systemf("%s --strip-components 2 -cf test2.tar "
					"d0/l1 d0/s1 d0/d1", testprog));
	else
		assertEqualInt(0, systemf("%s --strip-components 2 -cf test2.tar "
					"d0/l1 d0/d1", testprog));

	assertMakeDir("target2", 0755);
	assertEqualInt(0, systemf("%s -x -C target2 -f test2.tar", testprog));

	failure("d0/ is too short and should not have been archived");
	assertFileNotExists("target2/d0");
	failure("d0/d1/ is too short and should not have been archived");
	assertFileNotExists("target2/d1");
	failure("d0/s1 is too short and should not get restored");
	assertFileNotExists("target/s1");
	/* If platform supports symlinks, target/s2 is included. */
	if (canSymlink()) {
		failure("d0/d1/s2 is a symlink to something included in archive");
		assertIsSymlink("target2/s2", "d2/f1");
	}
	failure("d0/d1/d2 should be archived");
	assertIsDir("target2/d2", -1);

	/*
	 * Test 2b: Strip components creating archives involving hardlinks.
	 */
	failure("d0/l1 is too short and should not have been archived");
	assertFileNotExists("target/l1");
	failure("d0/d1/l2 is a hardlink to file whose name was too short");
	assertFileNotExists("target/l2");
	failure("d0/d1/d2/f1 is a hardlink to file whose name was too short");
	assertFileNotExists("target/d2/f1");
}